

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

Ref<anurbs::Line<3L>_> __thiscall
pybind11::detail::
argument_loader<anurbs::Model&,std::shared_ptr<anurbs::Line<3l>>,std::__cxx11::string_const&>::
call_impl<anurbs::Ref<anurbs::Line<3l>>,anurbs::Ref<anurbs::Line<3l>>(*&)(anurbs::Model&,std::shared_ptr<anurbs::Line<3l>>,std::__cxx11::string_const&),0ul,1ul,2ul,pybind11::detail::void_type>
          (argument_loader<anurbs::Model&,std::shared_ptr<anurbs::Line<3l>>,std::__cxx11::string_const&>
           *this,long f,undefined8 *param_3)

{
  code *pcVar1;
  itype *piVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::Line<3L>_> RVar3;
  __shared_ptr<anurbs::Line<3L>,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  pcVar1 = (code *)*param_3;
  piVar2 = detail::type_caster_base::operator_cast_to_Model_((type_caster_base *)(f + 0x48));
  std::__shared_ptr<anurbs::Line<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,(__shared_ptr<anurbs::Line<3L>,_(__gnu_cxx::_Lock_policy)2> *)(f + 0x38));
  (*pcVar1)(this,piVar2,&_Stack_38,f);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  RVar3.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Line<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar3.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Line<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::Line<3L>_>)
         RVar3.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::Line<3L>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Return call_impl(Func &&f, index_sequence<Is...>, Guard &&) {
        return std::forward<Func>(f)(cast_op<Args>(std::move(std::get<Is>(argcasters)))...);
    }